

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

Vec_Ptr_t * Abc_NtkDfsHie(Abc_Ntk_t *pNtk,int fCollectAll)

{
  int iVar1;
  Vec_Ptr_t *vNodes_00;
  Abc_Obj_t *pAVar2;
  int local_2c;
  int i;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  int fCollectAll_local;
  Abc_Ntk_t *pNtk_local;
  
  Abc_NtkIncrementTravId(pNtk);
  vNodes_00 = Vec_PtrAlloc(100);
  for (local_2c = 0; iVar1 = Abc_NtkPoNum(pNtk), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar2 = Abc_NtkPo(pNtk,local_2c);
    Abc_NtkDfsHie_rec(pAVar2,vNodes_00);
  }
  if (fCollectAll != 0) {
    for (local_2c = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_2c < iVar1; local_2c = local_2c + 1)
    {
      pAVar2 = Abc_NtkObj(pNtk,local_2c);
      if ((pAVar2 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_NodeIsTravIdCurrent(pAVar2), iVar1 == 0)) {
        Abc_NtkDfs_rec(pAVar2,vNodes_00);
      }
    }
  }
  return vNodes_00;
}

Assistant:

Vec_Ptr_t * Abc_NtkDfsHie( Abc_Ntk_t * pNtk, int fCollectAll )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    int i;
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_NtkDfsHie_rec( pObj, vNodes );
    // collect dangling nodes if asked to
    if ( fCollectAll )
    {
        Abc_NtkForEachObj( pNtk, pObj, i )
            if ( !Abc_NodeIsTravIdCurrent(pObj) )
                Abc_NtkDfs_rec( pObj, vNodes );
    }
    return vNodes;
}